

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repo_error.cpp
# Opt level: O2

string * __thiscall
pstore::repo::error_category::message_abi_cxx11_
          (string *__return_storage_ptr__,error_category *this,int error)

{
  char *pcVar1;
  allocator local_9;
  
  if (error - 1U < 5) {
    pcVar1 = &DAT_0013b410 + *(int *)(&DAT_0013b410 + (ulong)(error - 1U) * 4);
  }
  else {
    pcVar1 = "unknown error";
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,&local_9);
  return __return_storage_ptr__;
}

Assistant:

std::string error_category::message (int const error) const {
            auto * result = "unknown error";
            switch (static_cast<error_code> (error)) {
            case error_code::bad_fragment_record: result = "bad fragment record"; break;
            case error_code::bad_fragment_type: result = "bad fragment type"; break;
            case error_code::bad_compilation_record: result = "bad compilation record"; break;
            case error_code::too_many_members_in_compilation:
                result = "too many members in a compilation";
                break;
            case error_code::bss_section_too_large: result = "bss section too large"; break;
            }
            return result;
        }